

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int remove(char *__filename)

{
  char cVar1;
  int extraout_EAX;
  ostream *poVar2;
  int *piVar3;
  long *in_RSI;
  long *plVar4;
  path local_d0;
  undefined1 local_a8 [8];
  path imageDir;
  _Alloc_hider local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  
  local_78._M_p = (pointer)&__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff88,*(long *)__filename,
             *(long *)(__filename + 8) + *(long *)__filename);
  std::__cxx11::string::append((char *)&stack0xffffffffffffff88);
  std::filesystem::__cxx11::path::path
            ((path *)local_a8,(string_type *)&stack0xffffffffffffff88,auto_format);
  if ((size_type *)local_78._M_p != &__str._M_string_length) {
    operator_delete(local_78._M_p,__str._M_string_length + 1);
  }
  plVar4 = (long *)*in_RSI;
  imageDir._32_8_ = in_RSI[1];
  if (plVar4 != (long *)imageDir._32_8_) {
    do {
      local_50 = (undefined1  [8])&__str_1._M_string_length;
      std::__cxx11::string::_M_construct<char*>((string *)local_50,*plVar4,plVar4[1] + *plVar4);
      std::__cxx11::string::append((char *)local_50);
      std::filesystem::__cxx11::path::path(&local_d0,(string_type *)local_50,auto_format);
      std::filesystem::__cxx11::operator/
                ((path *)&stack0xffffffffffffff88,(path *)local_a8,&local_d0);
      std::filesystem::__cxx11::path::~path(&local_d0);
      if (local_50 != (undefined1  [8])&__str_1._M_string_length) {
        operator_delete((void *)local_50,__str_1._M_string_length + 1);
      }
      cVar1 = std::filesystem::status((path *)&stack0xffffffffffffff88);
      if ((cVar1 == -1) || (cVar1 == '\0')) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Image with ID ",0xe);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)*plVar4,plVar4[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," does not exist",0xf);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      }
      else {
        cVar1 = std::filesystem::remove((path *)&stack0xffffffffffffff88);
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Failed to remove image with ID ",0x1f);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)*plVar4,plVar4[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": [Errno ",9);
          piVar3 = __errno_location();
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Removed image with ID ",0x16);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)*plVar4,plVar4[1]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        }
      }
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff88);
      plVar4 = plVar4 + 4;
    } while (plVar4 != (long *)imageDir._32_8_);
  }
  std::filesystem::__cxx11::path::~path((path *)local_a8);
  return extraout_EAX;
}

Assistant:

void remove(const std::string& rootDir, const std::vector<std::string>& imageIds)
{
    std::filesystem::path imageDir(rootDir + "/images");
    for (const auto& imageId : imageIds)
    {
        auto imagePath = imageDir / (imageId + ".tar.gz");
        if (!std::filesystem::exists(imagePath))
        {
            std::cout << "Image with ID " << imageId << " does not exist" << std::endl;
        }
        else
        {
            if (std::filesystem::remove(imagePath))
                std::cout << "Removed image with ID " << imageId << std::endl;
            else
                std::cout << "Failed to remove image with ID " << imageId << ": [Errno " << errno << "]" << std::endl;
        }
    }
}